

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall boost::runtime::basic_param::value_help(basic_param *this,ostream *ostr)

{
  ulong uVar1;
  ostream *in_RSI;
  long in_RDI;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<(in_RSI,(string *)(in_RDI + 0x88));
  }
  else {
    std::operator<<(in_RSI,"<value>");
  }
  return;
}

Assistant:

virtual void            value_help( std::ostream& ostr ) const
    {
        if( p_value_hint.empty() )
            ostr << "<value>";
        else
            ostr << p_value_hint;
    }